

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::load(Application *this,SceneInfo *sceneInfo)

{
  Type TVar1;
  pointer pNVar2;
  LightInfo *light;
  Application *pAVar3;
  Scene *this_00;
  Matrix4x4 *extraout_RDX;
  Matrix4x4 *extraout_RDX_00;
  Matrix4x4 *pMVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double theta;
  Vector3D target;
  vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  lights;
  vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  objects;
  LightInfo default_light;
  double local_1c8;
  _Base_ptr local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  Vector4D local_198;
  undefined1 local_178 [8];
  pointer ppSStack_170;
  pointer local_168;
  double local_160;
  double local_158;
  _Base_ptr local_150;
  undefined1 local_148 [16];
  pointer local_138;
  Application *local_128;
  _Base_ptr local_120;
  vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  local_118;
  vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  local_100;
  undefined1 local_e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  double local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  Spectrum local_9c [9];
  
  local_178 = (undefined1  [8])0x0;
  ppSStack_170 = (pointer)0x0;
  local_168 = (pointer)0x0;
  local_138 = (pointer)0x0;
  local_148._0_8_ = (_Base_ptr)0x0;
  local_148._8_8_ = (_Base_ptr)0x0;
  uVar6 = (int)((long)(sceneInfo->nodes).
                      super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(sceneInfo->nodes).
                      super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3d70a3d7;
  local_128 = this;
  if ((int)uVar6 < 1) {
    local_1a8 = 0.0;
    local_1c8 = 0.0;
    local_1a0 = 0.0;
  }
  else {
    uVar7 = (ulong)(uVar6 & 0x7fffffff);
    lVar5 = 0x48;
    local_1b0 = 0.0;
    local_1b8 = 0.0;
    local_1c0 = (_Base_ptr)0x0;
    local_1a0 = 0.0;
    local_1c8 = 0.0;
    local_1a8 = 0.0;
    do {
      pNVar2 = (sceneInfo->nodes).
               super__Vector_base<CMU462::Collada::Node,_std::allocator<CMU462::Collada::Node>_>.
               _M_impl.super__Vector_impl_data._M_start;
      light = *(LightInfo **)((long)(pNVar2->transform).entries + lVar5 + 0xffffffffffffffb0U);
      TVar1 = (light->super_Instance).type;
      if (TVar1 < MATERIAL) {
        pMVar4 = (Matrix4x4 *)((long)(pNVar2->transform).entries + lVar5 + -0x48);
        switch(TVar1) {
        case CAMERA:
          local_198.x = local_1b0;
          local_198.y = local_1b8;
          local_198.z = (double)local_1c0;
          local_198.w = 1.0;
          Matrix4x4::operator*(pMVar4,&local_198);
          Vector4D::to3D((Vector4D *)local_e8);
          local_1b0 = local_160;
          local_1b8 = local_158;
          local_1c0 = local_150;
          local_198.x = *(double *)&light->light_type;
          local_198.y = *(double *)&(light->spectrum).g;
          local_198.z = (light->position).x;
          local_198.w = 1.0;
          Matrix4x4::operator*(pMVar4,&local_198);
          Vector4D::to3D((Vector4D *)local_e8);
          local_1a0 = (double)local_150 * (double)local_150 +
                      local_160 * local_160 + local_158 * local_158;
          if (local_1a0 < 0.0) {
            local_1a0 = sqrt(local_1a0);
            pMVar4 = extraout_RDX_00;
          }
          else {
            local_1a0 = SQRT(local_1a0);
            pMVar4 = extraout_RDX;
          }
          local_1a0 = 1.0 / local_1a0;
          local_1a8 = local_160 * local_1a0;
          local_1c8 = local_158 * local_1a0;
          local_1a0 = local_1a0 * (double)local_150;
          this = local_128;
          init_camera(local_128,(CameraInfo *)light,pMVar4);
          break;
        case LIGHT:
          local_e8._0_8_ = init_light(this,light,pMVar4);
          this = (Application *)local_178;
          std::
          vector<CMU462::DynamicScene::SceneLight*,std::allocator<CMU462::DynamicScene::SceneLight*>>
          ::emplace_back<CMU462::DynamicScene::SceneLight*>
                    ((vector<CMU462::DynamicScene::SceneLight*,std::allocator<CMU462::DynamicScene::SceneLight*>>
                      *)this,(SceneLight **)local_e8);
          break;
        case SPHERE:
          local_e8._0_8_ = init_sphere(this,(SphereInfo *)light,pMVar4);
          this = (Application *)local_148;
          std::
          vector<CMU462::DynamicScene::SceneObject*,std::allocator<CMU462::DynamicScene::SceneObject*>>
          ::emplace_back<CMU462::DynamicScene::SceneObject*>
                    ((vector<CMU462::DynamicScene::SceneObject*,std::allocator<CMU462::DynamicScene::SceneObject*>>
                      *)this,(SceneObject **)local_e8);
          break;
        case POLYMESH:
          local_e8._0_8_ = init_polymesh(this,(PolymeshInfo *)light,pMVar4);
          this = (Application *)local_148;
          std::
          vector<CMU462::DynamicScene::SceneObject*,std::allocator<CMU462::DynamicScene::SceneObject*>>
          ::emplace_back<CMU462::DynamicScene::SceneObject*>
                    ((vector<CMU462::DynamicScene::SceneObject*,std::allocator<CMU462::DynamicScene::SceneObject*>>
                      *)this,(SceneObject **)local_e8);
        }
      }
      lVar5 = lVar5 + 200;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  pAVar3 = local_128;
  if ((undefined1  [8])ppSStack_170 == local_178) {
    Collada::LightInfo::LightInfo((LightInfo *)local_e8);
    local_198.x = (double)operator_new(0x18);
    *(undefined ***)local_198.x = &PTR_get_static_light_002672d8;
    *(undefined8 *)((long)local_198.x + 8) = 0;
    *(undefined4 *)((long)local_198.x + 0x10) = 0;
    *(float *)((long)local_198.x + 0x10) = local_9c[0].b;
    *(undefined8 *)((long)local_198.x + 8) = local_9c[0]._0_8_;
    std::vector<CMU462::DynamicScene::SceneLight*,std::allocator<CMU462::DynamicScene::SceneLight*>>
    ::emplace_back<CMU462::DynamicScene::SceneLight*>
              ((vector<CMU462::DynamicScene::SceneLight*,std::allocator<CMU462::DynamicScene::SceneLight*>>
                *)local_178,(SceneLight **)&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_p != &local_b0) {
      operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._8_8_ != &local_d0) {
      operator_delete((void *)local_e8._8_8_,local_d0._M_allocated_capacity + 1);
    }
  }
  this_00 = (Scene *)operator_new(0x128);
  std::
  vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  ::vector(&local_100,
           (vector<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
            *)local_148);
  std::
  vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>::
  vector(&local_118,
         (vector<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
          *)local_178);
  DynamicScene::Scene::Scene(this_00,&local_100,&local_118);
  pAVar3->scene = this_00;
  if ((_Base_ptr)
      local_118.
      super__Vector_base<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_118.
                    super__Vector_base<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<CMU462::DynamicScene::SceneLight_*,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((Scene *)local_100.
               super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
               ._M_impl.super__Vector_impl_data._M_start != (Scene *)0x0) {
    operator_delete(local_100.
                    super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<CMU462::DynamicScene::SceneObject_*,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  DynamicScene::Scene::get_bbox((BBox *)local_e8,pAVar3->scene);
  if ((((double)local_d0._M_allocated_capacity <= (double)local_e8._0_8_) &&
      ((double)local_d0._8_8_ <= (double)local_e8._8_8_)) &&
     ((double)local_c0._M_p <= (double)local_e8._16_8_)) {
    local_198.x = ((double)local_d0._M_allocated_capacity + (double)local_e8._0_8_) * 0.5;
    local_198.y = ((double)local_d0._8_8_ + (double)local_e8._8_8_) * 0.5;
    local_198.z = ((double)local_c0._M_p + (double)local_e8._16_8_) * 0.5;
    dVar8 = (double)local_b0._8_8_ * (double)local_b0._8_8_ +
            local_b8 * local_b8 + (double)local_b0._M_allocated_capacity * (double)local_b0._0_8_;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    dVar8 = dVar8 * 0.5 * 1.5;
    pAVar3->canonical_view_distance = dVar8;
    local_120 = (_Base_ptr)acos(local_1c8);
    dVar9 = atan2(local_1a8,local_1a0);
    Camera::place(&pAVar3->canonicalCamera,(Vector3D *)&local_198,(double)local_120,dVar9,
                  dVar8 + dVar8,dVar8 / 10.0,dVar8 * 20.0);
    dVar9 = acos(local_1c8);
    theta = atan2(local_1a8,local_1a0);
    Camera::place(&pAVar3->camera,(Vector3D *)&local_198,dVar9,theta,dVar8 + dVar8,dVar8 / 10.0,
                  dVar8 * 20.0);
    pAVar3->scroll_rate = pAVar3->canonical_view_distance / 10.0;
  }
  DynamicScene::Scene::set_draw_styles
            (pAVar3->scene,&pAVar3->defaultStyle,&pAVar3->hoverStyle,&pAVar3->selectStyle);
  if ((_Base_ptr)local_148._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_148._0_8_,(long)local_138 - local_148._0_8_);
  }
  if (local_178 != (undefined1  [8])0x0) {
    operator_delete((void *)local_178,(long)local_168 - (long)local_178);
  }
  return;
}

Assistant:

void Application::load(SceneInfo* sceneInfo) {

  vector<Collada::Node>& nodes = sceneInfo->nodes;
  vector<DynamicScene::SceneLight *> lights;
  vector<DynamicScene::SceneObject *> objects;

  // save camera position to update camera control later
  CameraInfo *c;
  Vector3D c_pos = Vector3D();
  Vector3D c_dir = Vector3D();

  int len = nodes.size();
  for (int i = 0; i < len; i++) {
    Collada::Node& node = nodes[i];
    Collada::Instance *instance = node.instance;
    const Matrix4x4& transform = node.transform;

    switch(instance->type) {
      case Collada::Instance::CAMERA:
        c = static_cast<CameraInfo*>(instance);
        c_pos = (transform * Vector4D(c_pos,1)).to3D();
        c_dir = (transform * Vector4D(c->view_dir,1)).to3D().unit();
        init_camera(*c, transform);
        break;
      case Collada::Instance::LIGHT:
      {
        lights.push_back(
          init_light(static_cast<LightInfo&>(*instance), transform));
        break;
      }
      case Collada::Instance::SPHERE:
        objects.push_back(
          init_sphere(static_cast<SphereInfo&>(*instance), transform));
        break;
      case Collada::Instance::POLYMESH:
        objects.push_back(
          init_polymesh(static_cast<PolymeshInfo&>(*instance), transform));
        break;
      case Collada::Instance::MATERIAL:
        init_material(static_cast<MaterialInfo&>(*instance));
        break;
     }
  }

  if (lights.size() == 0) { // no lights, default use ambient_light
    LightInfo default_light = LightInfo();
    lights.push_back(new DynamicScene::AmbientLight(default_light));
  }
  scene = new DynamicScene::Scene(objects, lights);

  const BBox& bbox = scene->get_bbox();
  if (!bbox.empty()) {

    Vector3D target = bbox.centroid();
    canonical_view_distance = bbox.extent.norm() / 2 * 1.5;

    double view_distance = canonical_view_distance * 2;
    double min_view_distance = canonical_view_distance / 10.0;
    double max_view_distance = canonical_view_distance * 20.0;

    canonicalCamera.place(target,
                          acos(c_dir.y),
                          atan2(c_dir.x, c_dir.z),
                          view_distance,
                          min_view_distance,
                          max_view_distance);

    camera.place(target,
                acos(c_dir.y),
                atan2(c_dir.x, c_dir.z),
                view_distance,
                min_view_distance,
                max_view_distance);

    set_scroll_rate();
  }

  // set default draw styles for meshEdit -
  scene->set_draw_styles(&defaultStyle, &hoverStyle, &selectStyle);

  // cerr << "==================================" << endl;
  // cerr << "CAMERA" << endl;
  // cerr << "      hFov: " << camera.hFov << endl;
  // cerr << "      vFov: " << camera.vFov << endl;
  // cerr << "        ar: " << camera.ar << endl;
  // cerr << "     nClip: " << camera.nClip << endl;
  // cerr << "     fClip: " << camera.fClip << endl;
  // cerr << "       pos: " << camera.pos << endl;
  // cerr << " targetPos: " << camera.targetPos << endl;
  // cerr << "       phi: " << camera.phi << endl;
  // cerr << "     theta: " << camera.theta << endl;
  // cerr << "         r: " << camera.r << endl;
  // cerr << "      minR: " << camera.minR << endl;
  // cerr << "      maxR: " << camera.maxR << endl;
  // cerr << "       c2w: " << camera.c2w << endl;
  // cerr << "   screenW: " << camera.screenW << endl;
  // cerr << "   screenH: " << camera.screenH << endl;
  // cerr << "screenDist: " << camera.screenDist<< endl;
  // cerr << "==================================" << endl;
}